

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcShow.c
# Opt level: O3

void Abc_NtkWriteFlopDependency(Abc_Ntk_t *pNtk,char *pFileName)

{
  char *pcVar1;
  long *plVar2;
  void **__ptr;
  int iVar3;
  Abc_Obj_t *in_RAX;
  FILE *__stream;
  char *pcVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  Abc_Obj_t *pObj;
  Abc_Obj_t *local_38;
  
  local_38 = in_RAX;
  __stream = fopen(pFileName,"w");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open input file %s.\n",pFileName);
    return;
  }
  pcVar1 = pNtk->pName;
  pcVar4 = Extra_TimeStamp();
  fprintf(__stream,"# Flop dependency for \"%s\" generated by ABC on %s\n",pcVar1,pcVar4);
  fwrite("digraph G {\n",0xc,1,__stream);
  fwrite("  graph [splines=true overlap=false];\n",0x26,1,__stream);
  fwrite("  size = \"7.5,10\";\n",0x13,1,__stream);
  fwrite("  center = true;\n",0x11,1,__stream);
  fwrite("  edge [dir=forward];\n",0x16,1,__stream);
  pVVar5 = pNtk->vBoxes;
  if (0 < pVVar5->nSize) {
    uVar7 = 0;
    do {
      plVar2 = (long *)pVVar5->pArray[uVar7];
      if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
        local_38 = *(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
        plVar2 = (long *)local_38->pNtk->vObjs->pArray[*(local_38->vFanouts).pArray];
        *(int *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8) +
                0x40) = (int)uVar7;
        pVVar5 = Abc_NtkNodeSupport(pNtk,&local_38,1);
        __ptr = pVVar5->pArray;
        if ((long)pVVar5->nSize < 1) {
          uVar8 = 0;
          if (__ptr != (void **)0x0) goto LAB_001f49ad;
        }
        else {
          lVar6 = 0;
          uVar8 = 0;
          do {
            uVar8 = (ulong)((int)uVar8 + (uint)((*(uint *)((long)__ptr[lVar6] + 0x14) & 0xf) == 2));
            lVar6 = lVar6 + 1;
          } while (pVVar5->nSize != lVar6);
LAB_001f49ad:
          free(__ptr);
        }
        free(pVVar5);
        fprintf(__stream,"  { rank = same; %d [label=\"%d(%d)\"]; }\n",uVar7 & 0xffffffff,
                uVar7 & 0xffffffff,uVar8);
        pVVar5 = pNtk->vBoxes;
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)pVVar5->nSize);
    if (0 < pVVar5->nSize) {
      uVar7 = 0;
      do {
        plVar2 = (long *)pVVar5->pArray[uVar7];
        if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
          local_38 = *(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
          pVVar5 = Abc_NtkNodeSupport(pNtk,&local_38,1);
          iVar3 = pVVar5->nSize;
          if (0 < iVar3) {
            lVar6 = 0;
            do {
              if ((*(uint *)((long)pVVar5->pArray[lVar6] + 0x14) & 0xf) != 2) {
                fprintf(__stream,"  %4d -> %4d\n",
                        (ulong)*(uint *)((long)pVVar5->pArray[lVar6] + 0x40),uVar7 & 0xffffffff);
                iVar3 = pVVar5->nSize;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < iVar3);
          }
          if (pVVar5->pArray != (void **)0x0) {
            free(pVVar5->pArray);
          }
          free(pVVar5);
          pVVar5 = pNtk->vBoxes;
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)pVVar5->nSize);
    }
  }
  fwrite("}\n",2,1,__stream);
  fclose(__stream);
  return;
}

Assistant:

void Abc_NtkWriteFlopDependency( Abc_Ntk_t * pNtk, char * pFileName )
{
    FILE * pFile;
    Vec_Ptr_t * vSupp;
    Abc_Obj_t * pObj, * pTemp;
    int i, k, Count;
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        printf( "Cannot open input file %s.\n", pFileName );
        return;
    }
    fprintf( pFile, "# Flop dependency for \"%s\" generated by ABC on %s\n", Abc_NtkName(pNtk), Extra_TimeStamp() );
    fprintf( pFile, "digraph G {\n" );
    fprintf( pFile, "  graph [splines=true overlap=false];\n" );
    fprintf( pFile, "  size = \"7.5,10\";\n" );
    fprintf( pFile, "  center = true;\n" );
//    fprintf( pFile, "  edge [len=3,dir=forward];\n" );
    fprintf( pFile, "  edge [dir=forward];\n" );
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
    {
        Abc_ObjFanout0( Abc_ObjFanout0(pObj) )->iTemp = i;
        vSupp = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        Count = 0;
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pTemp, k )
            Count += Abc_ObjIsPi(pTemp);
        Vec_PtrFree( vSupp );
        fprintf( pFile, "  { rank = same; %d [label=\"%d(%d)\"]; }\n", i, i, Count );
    }
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
    {
        vSupp = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        Count = 0;
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pTemp, k )
            if ( !Abc_ObjIsPi(pTemp) )
                fprintf( pFile, "  %4d -> %4d\n", pTemp->iTemp, i );
        Vec_PtrFree( vSupp );
    }
    fprintf( pFile, "}\n" );
    fclose( pFile );
}